

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

int Dtt_PrintStats(int nNodes,int nVars,Vec_Wec_t *vFunNodes,word nSteps,abctime clk,int fDelay,
                  word nMultis)

{
  int iVar1;
  undefined8 uVar2;
  Vec_Int_t *pVVar3;
  abctime aVar4;
  abctime time;
  int i;
  int i_00;
  int Counter;
  int iVar5;
  
  pVVar3 = Vec_WecEntry(vFunNodes,nNodes);
  iVar1 = pVVar3->nSize;
  uVar2 = 0x44;
  if (fDelay == 0) {
    uVar2 = 0x4e;
  }
  printf("%c =%2d  |  ",uVar2,(ulong)(uint)nNodes);
  printf("C =%12.0f  |  ",(double)(long)nSteps);
  printf("New%d =%10d   ",nVars,(ulong)(iVar1 + (uint)(nNodes == 0)));
  iVar5 = 0;
  for (i_00 = 0; i_00 < vFunNodes->nSize; i_00 = i_00 + 1) {
    pVVar3 = Vec_WecEntry(vFunNodes,i_00);
    iVar5 = iVar5 + pVVar3->nSize;
  }
  printf("All%d =%10d  |  ",nVars,(ulong)(iVar5 + 1));
  printf("Multi =%10d  |  ",nMultis);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x82525c,(char *)(aVar4 - clk),time);
  fflush(_stdout);
  return iVar1;
}

Assistant:

int Dtt_PrintStats( int nNodes, int nVars, Vec_Wec_t * vFunNodes, word nSteps, abctime clk, int fDelay, word nMultis )
{
    int nNew = Vec_IntSize(Vec_WecEntry(vFunNodes, nNodes));
    printf("%c =%2d  |  ",     fDelay ? 'D':'N', nNodes );
    printf("C =%12.0f  |  ",   (double)(iword)nSteps );
    printf("New%d =%10d   ",   nVars, nNew + (int)(nNodes==0) );
    printf("All%d =%10d  |  ", nVars, Vec_WecSizeSize(vFunNodes)+1 );
    printf("Multi =%10d  |  ", (int)nMultis );
    Abc_PrintTime( 1, "Time",  Abc_Clock() - clk );
    //Abc_Print(1, "%9.2f sec\n", 1.0*(Abc_Clock() - clk)/(CLOCKS_PER_SEC));
    fflush(stdout);
    return nNew;
}